

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ticket-translation.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  variant_alternative_t<1UL,_variant<int,_basic_ifstream<char>_>_> *file_00;
  ostream *poVar1;
  size_t sVar2;
  variant_alternative_t<0UL,_variant<int,_basic_ifstream<char>_>_> *pvVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  puzzle solved;
  puzzle puzzle;
  variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_330;
  puzzle local_318;
  puzzle local_2d0;
  puzzle local_288;
  _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_> local_240;
  
  if (argc == 2) {
    get_input((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)&local_240,2,argv
             );
    if (local_240._M_index == '\0') {
      pvVar3 = std::get<0ul,int,std::ifstream>
                         ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                          &local_240);
      iVar4 = *pvVar3;
    }
    else {
      file_00 = std::get<1ul,int,std::ifstream>
                          ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                           &local_240);
      tokenize_abi_cxx11_<std::ifstream>(&local_330,file_00);
      read_input(&local_288,&local_330);
      ticket_scanning_error_rate(&local_288);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Part 1: ",8);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::vector<puzzle::field,_std::allocator<puzzle::field>_>::vector
                (&local_318.fields,&local_288.fields);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_318.mine,&local_288.mine);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::vector(&local_318.tickets,&local_288.tickets);
      resolve_field_order(&local_2d0,&local_318);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector(&local_318.tickets);
      if (local_318.mine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_318.mine.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_318.mine.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_318.mine.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<puzzle::field,_std::allocator<puzzle::field>_>::~vector(&local_318.fields);
      if (local_2d0.fields.super__Vector_base<puzzle::field,_std::allocator<puzzle::field>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          local_2d0.fields.super__Vector_base<puzzle::field,_std::allocator<puzzle::field>_>._M_impl
          .super__Vector_impl_data._M_start) {
        lVar6 = 0;
        uVar5 = 0;
        do {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&((local_2d0.fields.
                               super__Vector_base<puzzle::field,_std::allocator<puzzle::field>_>.
                               _M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                     lVar6),"departure",0,9);
          uVar5 = uVar5 + 1;
          lVar6 = lVar6 + 0x40;
        } while (uVar5 < (ulong)((long)local_2d0.fields.
                                       super__Vector_base<puzzle::field,_std::allocator<puzzle::field>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2d0.fields.
                                       super__Vector_base<puzzle::field,_std::allocator<puzzle::field>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 6));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Part 2: ",8);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector(&local_2d0.tickets);
      if (local_2d0.mine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2d0.mine.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2d0.mine.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d0.mine.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<puzzle::field,_std::allocator<puzzle::field>_>::~vector(&local_2d0.fields);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector(&local_288.tickets);
      if (local_288.mine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_288.mine.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_288.mine.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_288.mine.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<puzzle::field,_std::allocator<puzzle::field>_>::~vector(&local_288.fields);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_330);
      iVar4 = 0;
    }
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_>::
    ~_Variant_storage(&local_240);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10a108);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," {path-to-file}",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  if (argc != 2) {
    std::cout << "Usage: " << argv[0] << " {path-to-file}" << std::endl;
    return 1;
  }

  auto file = get_input(argc, argv);

  if (std::holds_alternative<int>(file))
    return std::get<int>(file);

  auto& input = std::get<std::ifstream>(file);

  auto tokens = tokenize(input);

  auto puzzle = read_input(tokens);

  auto a1 = ticket_scanning_error_rate(puzzle);
  std::cout << "Part 1: " << a1 << "\n";

  auto solved = resolve_field_order(puzzle);
  auto a2 = uint64_t {1};
  for (size_t i = 0; i < solved.fields.size(); i++) {
    if (solved.fields[i].name.find("departure") == 0) {
      a2 *= solved.mine[i];
    }
  }

  std::cout << "Part 2: " << a2 << "\n";
  std::cout << a1 << "\n" << a2 << std::endl;
}